

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ed25519.cc
# Opt level: O2

int pkey_ed25519_verify_message
              (EVP_PKEY_CTX *ctx,uint8_t *sig,size_t siglen,uint8_t *tbs,size_t tbslen)

{
  int iVar1;
  
  if ((siglen == 0x40) &&
     (iVar1 = ED25519_verify(tbs,tbslen,sig,(uint8_t *)((long)ctx->pkey->pkey + 0x20)), iVar1 != 0))
  {
    return 1;
  }
  ERR_put_error(6,0,0x83,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ed25519.cc"
                ,0x50);
  return 0;
}

Assistant:

static int pkey_ed25519_verify_message(EVP_PKEY_CTX *ctx, const uint8_t *sig,
                                       size_t siglen, const uint8_t *tbs,
                                       size_t tbslen) {
  const ED25519_KEY *key =
      reinterpret_cast<const ED25519_KEY *>(ctx->pkey->pkey);
  if (siglen != 64 ||
      !ED25519_verify(tbs, tbslen, sig, key->key + ED25519_PUBLIC_KEY_OFFSET)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_SIGNATURE);
    return 0;
  }

  return 1;
}